

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-expression.c
# Opt level: O1

int32_t expression_evaluate(expression_t *expression)

{
  expression_operation_t *peVar1;
  int iVar2;
  size_t sVar3;
  
  if (expression->base_value == (expression_base_value_f)0x0) {
    iVar2 = 0;
  }
  else {
    iVar2 = (*expression->base_value)();
  }
  if (expression->operation_count != 0) {
    peVar1 = expression->operations;
    sVar3 = 0;
    do {
      switch(peVar1[sVar3].operator) {
      case '\x01':
        iVar2 = iVar2 + peVar1[sVar3].operand;
        break;
      case '\x02':
        iVar2 = iVar2 - peVar1[sVar3].operand;
        break;
      case '\x03':
        iVar2 = iVar2 * peVar1[sVar3].operand;
        break;
      case '\x04':
        iVar2 = iVar2 / (int)peVar1[sVar3].operand;
        break;
      case '\x05':
        iVar2 = -iVar2;
      }
      sVar3 = sVar3 + 1;
    } while (expression->operation_count != sVar3);
  }
  return iVar2;
}

Assistant:

int32_t expression_evaluate(expression_t const * const expression)
{
	size_t i;
	int32_t value = 0;

	if (expression->base_value != NULL)
		value = expression->base_value();

	for (i = 0; i < expression->operation_count; i++) {
		switch (expression->operations[i].operator) {
			case OPERATOR_ADD:
				value += expression->operations[i].operand;
				break;
			case OPERATOR_SUB:
				value -= expression->operations[i].operand;
				break;
			case OPERATOR_MUL:
				value *= expression->operations[i].operand;
				break;
			case OPERATOR_DIV:
				value /= expression->operations[i].operand;
				break;
			case OPERATOR_NEG:
				value = -value;
				break;
			default:
				break;
		}
	}

	return value;
}